

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntBounds.cpp
# Opt level: O3

void __thiscall
IntBounds::SetBound<true>
          (IntBounds *this,int constantBoundBase,int offset,bool wasEstablishedExplicitly)

{
  bool bVar1;
  undefined8 in_RAX;
  int local_14 [2];
  int constantBound;
  
  local_14[0] = (int)((ulong)in_RAX >> 0x20);
  if ((((offset == 0) ||
       (bVar1 = Int32Math::Add(constantBoundBase,offset,local_14), constantBoundBase = local_14[0],
       !bVar1)) && (this->constantLowerBound < constantBoundBase)) &&
     (constantBoundBase <= this->constantUpperBound)) {
    this->constantLowerBound = constantBoundBase;
  }
  return;
}

Assistant:

void IntBounds::SetBound(const int constantBoundBase, const int offset, const bool wasEstablishedExplicitly)
{
    int constantBound;
    if(offset == 0)
        constantBound = constantBoundBase;
    else if(Int32Math::Add(constantBoundBase, offset, &constantBound))
        return;

    if(Lower)
        SetLowerBound(constantBound);
    else
        SetUpperBound(constantBound, wasEstablishedExplicitly);
}